

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

double __thiscall tetgenmesh::shortdistance(tetgenmesh *this,double *p,double *e1,double *e2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar3 = *e2 - *e1;
  dVar5 = e2[1] - e1[1];
  dVar2 = e2[2] - e1[2];
  dVar4 = *p - *e1;
  dVar6 = p[1] - e1[1];
  dVar1 = p[2] - e1[2];
  dVar7 = SQRT(dVar2 * dVar2 + dVar3 * dVar3 + dVar5 * dVar5);
  dVar2 = (dVar2 / dVar7) * dVar1 + (dVar3 / dVar7) * dVar4 + (dVar5 / dVar7) * dVar6;
  dVar1 = (dVar1 * dVar1 + dVar4 * dVar4 + dVar6 * dVar6) - dVar2 * dVar2;
  if (0.0 <= dVar1) {
    return SQRT(dVar1);
  }
  dVar1 = sqrt(dVar1);
  return dVar1;
}

Assistant:

REAL tetgenmesh::shortdistance(REAL* p, REAL* e1, REAL* e2)
{
  REAL v1[3], v2[3];
  REAL len, l_p;

  v1[0] = e2[0] - e1[0];
  v1[1] = e2[1] - e1[1];
  v1[2] = e2[2] - e1[2];
  v2[0] = p[0] - e1[0];
  v2[1] = p[1] - e1[1];
  v2[2] = p[2] - e1[2];

  len = sqrt(dot(v1, v1));

  v1[0] /= len;
  v1[1] /= len;
  v1[2] /= len;
  l_p = dot(v1, v2);

  return sqrt(dot(v2, v2) - l_p * l_p);
}